

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  Request req2;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [560];
  
  if ((req->path)._M_string_length == 0) {
    *error = Connection;
  }
  else {
    iVar2 = (*this->_vptr_ClientImpl[6])();
    if ((((char)iVar2 == '\0') && ((this->proxy_host_)._M_string_length != 0)) &&
       (this->proxy_port_ != -1)) {
      Request::Request((Request *)local_260,req);
      std::operator+(&local_280,"http://",&this->host_and_port_);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_280,(ulong)(req->path)._M_dataplus._M_p);
      local_2a0 = &local_290;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_290 = *plVar4;
        lStack_288 = plVar3[3];
      }
      else {
        local_290 = *plVar4;
        local_2a0 = (long *)*plVar3;
      }
      local_298 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)(local_260 + 0x20),(string *)&local_2a0);
      if (local_2a0 != &local_290) {
        operator_delete(local_2a0,local_290 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      bVar1 = process_request(this,strm,(Request *)local_260,res,close_connection,error);
      Request::~Request((Request *)local_260);
    }
    else {
      bVar1 = process_request(this,strm,req,res,close_connection,error);
    }
    if (bVar1) {
      if (0x62 < res->status - 0x12dU) {
        return true;
      }
      if (this->follow_location_ != true) {
        return true;
      }
      bVar1 = redirect(this,req,res,error);
      return bVar1;
    }
  }
  return false;
}

Assistant:

inline bool ClientImpl::handle_request(Stream &strm, const Request &req,
										   Response &res, bool close_connection,
										   Error &error) {
		if (req.path.empty()) {
			error = Error::Connection;
			return false;
		}

		bool ret;

		if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
			auto req2 = req;
			req2.path = "http://" + host_and_port_ + req.path;
			ret = process_request(strm, req2, res, close_connection, error);
		} else {
			ret = process_request(strm, req, res, close_connection, error);
		}

		if (!ret) { return false; }

		if (300 < res.status && res.status < 400 && follow_location_) {
			ret = redirect(req, res, error);
		}

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
		if ((res.status == 401 || res.status == 407) &&
      req.authorization_count_ < 5) {
    auto is_proxy = res.status == 407;
    const auto &username =
        is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
    const auto &password =
        is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

    if (!username.empty() && !password.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res, auth, is_proxy)) {
        Request new_req = req;
        new_req.authorization_count_ += 1;
        auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
        new_req.headers.erase(key);
        new_req.headers.insert(detail::make_digest_authentication_header(
            req, auth, new_req.authorization_count_, detail::random_string(10),
            username, password, is_proxy));

        Response new_res;

        ret = send(new_req, new_res, error);
        if (ret) { res = new_res; }
      }
    }
  }
#endif

		return ret;
	}